

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O3

REF_STATUS ref_phys_normal_spacing(REF_GRID ref_grid,REF_DBL *normalspacing)

{
  int *piVar1;
  REF_NODE ref_node;
  REF_GLOB *pRVar2;
  REF_CELL ref_cell;
  REF_DBL *pRVar3;
  REF_GRID ref_grid_00;
  REF_STATUS RVar4;
  uint uVar5;
  void *__s;
  long lVar6;
  long lVar7;
  ulong uVar8;
  undefined8 uVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  REF_INT ntri;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  int local_154;
  REF_GRID local_150;
  REF_CELL local_148;
  REF_INT local_140 [2];
  double local_138;
  double local_130;
  double local_128;
  REF_INT local_118;
  REF_INT local_114;
  int local_a8;
  int local_a4;
  int local_a0;
  
  ref_node = ref_grid->node;
  uVar5 = ref_node->max;
  lVar12 = (long)(int)uVar5;
  if (0 < lVar12) {
    pRVar2 = ref_node->global;
    lVar6 = 0;
    do {
      if (-1 < pRVar2[lVar6]) {
        normalspacing[lVar6] = 0.0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar12 != lVar6);
  }
  if ((int)uVar5 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x3d4,
           "ref_phys_normal_spacing","malloc hits of REF_INT negative");
LAB_001f1094:
    uVar5 = 1;
  }
  else {
    local_150 = ref_grid;
    __s = malloc(lVar12 << 2);
    if (__s == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x3d4,
             "ref_phys_normal_spacing","malloc hits of REF_INT NULL");
      uVar5 = 2;
    }
    else {
      if (0 < (int)uVar5) {
        memset(__s,0,lVar12 << 2);
      }
      ref_grid_00 = local_150;
      if (local_150->twod == 0) {
        pcVar11 = "implement 3D";
        uVar5 = 6;
        uVar9 = 0x3f6;
        uVar8 = 6;
      }
      else {
        ref_cell = local_150->cell[0];
        if (0 < ref_cell->max) {
          local_148 = local_150->cell[3];
          iVar10 = 0;
          do {
            RVar4 = ref_cell_nodes(ref_cell,iVar10,&local_118);
            if (RVar4 == 0) {
              uVar5 = ref_layer_interior_seg_normal(ref_grid_00,iVar10,&local_138);
              if (uVar5 != 0) {
                pcVar11 = "edge norm";
                uVar9 = 0x3df;
                goto LAB_001f11b6;
              }
              uVar5 = ref_cell_list_with2(ref_grid_00->cell[3],local_118,local_114,2,&local_154,
                                          local_140);
              if (uVar5 != 0) {
                pcVar11 = "tri with2";
                uVar9 = 0x3e2;
                goto LAB_001f11b6;
              }
              if ((long)local_154 != 1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x3e3,"ref_phys_normal_spacing","edg expects one tri",1,(long)local_154);
                goto LAB_001f1094;
              }
              uVar5 = ref_cell_nodes(local_148,local_140[0],&local_a8);
              if (uVar5 != 0) {
                pcVar11 = "tri nodes";
                uVar9 = 0x3e5;
                goto LAB_001f11b6;
              }
              lVar12 = (long)local_118;
              lVar6 = (long)local_114;
              pRVar3 = ref_node->real;
              lVar7 = (long)((((local_a8 - local_118) + local_a4 + local_a0) - local_114) * 0xf);
              dVar13 = (pRVar3[lVar7 + 2] - pRVar3[lVar12 * 0xf + 2]) * local_128 +
                       (pRVar3[lVar7] - pRVar3[lVar12 * 0xf]) * local_138 +
                       (pRVar3[lVar7 + 1] - pRVar3[lVar12 * 0xf + 1]) * local_130;
              normalspacing[lVar12] = normalspacing[lVar12] + dVar13;
              piVar1 = (int *)((long)__s + lVar12 * 4);
              *piVar1 = *piVar1 + 1;
              normalspacing[lVar6] = dVar13 + normalspacing[lVar6];
              piVar1 = (int *)((long)__s + lVar6 * 4);
              *piVar1 = *piVar1 + 1;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < ref_cell->max);
          uVar5 = ref_node->max;
        }
        if (0 < (int)uVar5) {
          pRVar2 = ref_node->global;
          uVar8 = 0;
          do {
            if ((-1 < pRVar2[uVar8]) && (iVar10 = *(int *)((long)__s + uVar8 * 4), 0 < iVar10)) {
              normalspacing[uVar8] = normalspacing[uVar8] / (double)iVar10;
            }
            uVar8 = uVar8 + 1;
          } while (uVar5 != uVar8);
        }
        free(__s);
        uVar5 = ref_node_ghost_dbl(ref_node,normalspacing,1);
        if (uVar5 == 0) {
          return 0;
        }
        pcVar11 = "ghost normalspacing";
        uVar9 = 0x3ff;
LAB_001f11b6:
        uVar8 = (ulong)uVar5;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar9,
             "ref_phys_normal_spacing",uVar8,pcVar11);
    }
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_phys_normal_spacing(REF_GRID ref_grid,
                                           REF_DBL *normalspacing) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) { normalspacing[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, dxyz[3], edg_norm[3];
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      dn = ref_math_dot(dxyz, edg_norm);
      normalspacing[edg_nodes[0]] += dn;
      hits[edg_nodes[0]] += 1;
      normalspacing[edg_nodes[1]] += dn;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      normalspacing[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, normalspacing, 1), "ghost normalspacing");

  return REF_SUCCESS;
}